

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int main(void)

{
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  path local_30;
  
  std::filesystem::__cxx11::path::path<char[39],std::filesystem::__cxx11::path>
            (&local_30,(char (*) [39])"/home/fourstring/CLionProjects/lsmtree",auto_format);
  std::filesystem::current_path(&local_30);
  std::filesystem::__cxx11::path::~path(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"should be able to move a memtable",&local_61);
  it<bool(*)()>(&local_60,test_memtable_move);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"should distinguish two strings by space in a binary file",
             &local_89);
  it<bool(*)()>(&local_88,test_string_fileio);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"should read/write number as bytes correctly",&local_b1);
  it<bool(*)()>(&local_b0,test_bytes_level_IO);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"should follow definition of MemTable",&local_d9);
  it<bool(*)()>(&local_d8,test_memtable_behavior);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"should correctly implement SSTable",&local_101);
  it<bool(*)()>(&local_100,test_SSTable_behavior);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "should correctly read/write bytes between SSTable in memory and disk.",&local_129);
  it<bool(*)()>(&local_128,test_SSTable_fileIO);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"should correctly implement DiskTableNode",&local_151);
  it<bool(*)()>(&local_150,test_DiskTableNode_behavior);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"should merge data correctly",&local_179);
  it<bool(*)()>(&local_178,test_SSTableData_merge);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"should correctly erase data in vector",&local_1a1);
  it<bool(*)()>(&local_1a0,test_vector_erase);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"should read sstable correctly",&local_1c9);
  it<bool(*)()>(&local_1c8,test_SSTable_input);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  return 0;
}

Assistant:

int main() {
    current_path("/home/fourstring/CLionProjects/lsmtree");
    it("should be able to move a memtable", test_memtable_move);
    it("should distinguish two strings by space in a binary file", test_string_fileio);
    it("should read/write number as bytes correctly", test_bytes_level_IO);
    it("should follow definition of MemTable", test_memtable_behavior);
    it("should correctly implement SSTable", test_SSTable_behavior);
    it("should correctly read/write bytes between SSTable in memory and disk.", test_SSTable_fileIO);
    it("should correctly implement DiskTableNode", test_DiskTableNode_behavior);
    it("should merge data correctly", test_SSTableData_merge);
    it("should correctly erase data in vector", test_vector_erase);
    it("should read sstable correctly", test_SSTable_input);
}